

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O0

void __thiscall cfdcapi_psbt_GetPsbtInput_Test::TestBody(cfdcapi_psbt_GetPsbtInput_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char *pcVar5;
  char *in_R9;
  AssertionResult gtest_ar_64;
  AssertionResult gtest_ar_63;
  AssertionResult gtest_ar_62;
  AssertionResult gtest_ar_61;
  AssertionResult gtest_ar_60;
  AssertionResult gtest_ar_59;
  AssertionResult gtest_ar_58;
  AssertionResult gtest_ar_57;
  char *exp_unknown_value;
  char *unknown_key;
  AssertionResult gtest_ar_56;
  AssertionResult gtest_ar_55;
  AssertionResult gtest_ar_54;
  char *value;
  AssertionResult gtest_ar_53;
  AssertionResult gtest_ar_52;
  AssertionResult gtest_ar_51;
  AssertionResult gtest_ar_50;
  AssertionResult gtest_ar_49;
  AssertionResult gtest_ar_48;
  AssertionResult gtest_ar_47;
  AssertionResult gtest_ar_46;
  AssertionResult gtest_ar_45;
  AssertionResult gtest_ar_44;
  AssertionResult gtest_ar_43;
  AssertionResult gtest_ar_42;
  AssertionResult gtest_ar_41;
  AssertionResult gtest_ar_40;
  AssertionResult gtest_ar_39;
  AssertionResult gtest_ar_38;
  uint32_t index_1;
  char *pk_1;
  AssertionResult gtest_ar_37;
  AssertionResult gtest_ar_36;
  AssertionResult gtest_ar_35;
  AssertionResult gtest_ar_34;
  AssertionResult gtest_ar_33;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  uint32_t index;
  char *pk;
  AssertionResult gtest_ar_27;
  uint32_t list_num;
  void *pubkey_list_handle;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  char *path;
  char *fingerprint;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  char *signature;
  AssertionResult gtest_ar_18;
  char *pubkey;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  char *tx;
  char *descriptor;
  char *locking_script;
  int64_t amount;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  char *script;
  uint32_t vout;
  char *txid;
  uint32_t txin_index;
  AssertionResult gtest_ar_1;
  char *psbt_base64;
  void *psbt_handle;
  int net_type;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_ffffffffffffeef8;
  type *ptVar6;
  AssertionResult *in_stack_ffffffffffffef00;
  Secret *in_stack_ffffffffffffef08;
  char *in_stack_ffffffffffffef10;
  void **in_stack_ffffffffffffef18;
  void *in_stack_ffffffffffffef38;
  undefined8 in_stack_ffffffffffffef40;
  AssertionResult *pAVar7;
  char *in_stack_ffffffffffffefb0;
  void *in_stack_ffffffffffffefb8;
  AssertionResult *in_stack_fffffffffffff0c0;
  uint32_t in_stack_fffffffffffff0c8;
  int in_stack_fffffffffffff0cc;
  char *in_stack_fffffffffffff0d0;
  AssertionResult *in_stack_fffffffffffff0d8;
  undefined7 in_stack_fffffffffffff0e0;
  undefined1 in_stack_fffffffffffff0e7;
  uint32_t *in_stack_fffffffffffff0e8;
  undefined8 in_stack_fffffffffffff0f0;
  uint32_t vout_00;
  AssertionResult *pAVar8;
  undefined7 in_stack_fffffffffffff0f8;
  undefined1 in_stack_fffffffffffff0ff;
  char **in_stack_fffffffffffff100;
  char **in_stack_fffffffffffff108;
  undefined7 in_stack_fffffffffffff110;
  undefined1 in_stack_fffffffffffff117;
  undefined7 in_stack_fffffffffffff158;
  undefined1 in_stack_fffffffffffff15f;
  char *in_stack_fffffffffffff160;
  AssertionResult *in_stack_fffffffffffff168;
  undefined7 in_stack_fffffffffffff170;
  undefined1 in_stack_fffffffffffff177;
  char *in_stack_fffffffffffff178;
  AssertionResult *in_stack_fffffffffffff198;
  undefined7 in_stack_fffffffffffff1a0;
  undefined1 in_stack_fffffffffffff1a7;
  char *in_stack_fffffffffffff1a8;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffff1b8;
  undefined7 in_stack_fffffffffffff1e8;
  undefined1 in_stack_fffffffffffff1ef;
  uint32_t *in_stack_fffffffffffff1f0;
  AssertionResult *in_stack_fffffffffffff1f8;
  undefined7 in_stack_fffffffffffff200;
  undefined1 in_stack_fffffffffffff207;
  char *in_stack_fffffffffffff208;
  undefined7 in_stack_fffffffffffff308;
  undefined1 in_stack_fffffffffffff30f;
  char **in_stack_fffffffffffff310;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffff320;
  char *in_stack_fffffffffffff328;
  char *in_stack_fffffffffffff360;
  AssertionResult *this_02;
  uint32_t in_stack_fffffffffffff368;
  int in_stack_fffffffffffff36c;
  undefined4 uVar9;
  char **in_stack_fffffffffffff370;
  void *in_stack_fffffffffffff378;
  undefined7 in_stack_fffffffffffff380;
  char *in_stack_fffffffffffff388;
  undefined8 in_stack_fffffffffffff3e8;
  char *in_stack_fffffffffffff3f0;
  undefined7 in_stack_fffffffffffff3f8;
  undefined1 in_stack_fffffffffffff3ff;
  undefined8 in_stack_fffffffffffff400;
  int net_type_00;
  void *in_stack_fffffffffffff408;
  void **in_stack_fffffffffffff420;
  undefined7 in_stack_fffffffffffff428;
  undefined1 in_stack_fffffffffffff42f;
  char *in_stack_fffffffffffff430;
  AssertionResult *in_stack_fffffffffffff438;
  undefined7 in_stack_fffffffffffff440;
  undefined1 in_stack_fffffffffffff447;
  char *in_stack_fffffffffffff448;
  AssertHelper local_ab8;
  Message local_ab0;
  undefined4 local_aa4;
  AssertionResult local_aa0;
  AssertHelper local_a90;
  Message local_a88;
  undefined4 local_a7c;
  AssertionResult local_a78;
  AssertHelper local_a68;
  Message local_a60;
  undefined4 local_a54;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff5b8;
  AssertHelper in_stack_fffffffffffff5c0;
  uint32_t in_stack_fffffffffffff5c8;
  int in_stack_fffffffffffff5cc;
  void *in_stack_fffffffffffff5d0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff5d8;
  AssertHelper local_a20;
  Message local_a18;
  undefined4 in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f4;
  AssertionResult local_a08;
  AssertHelper local_9f8;
  Message local_9f0;
  undefined4 local_9e4;
  AssertionResult local_9e0;
  AssertHelper local_9d0;
  Message local_9c8;
  undefined4 local_9bc;
  AssertionResult local_9b8;
  AssertHelper local_9a8;
  Message local_9a0;
  undefined4 local_994;
  AssertionResult local_990;
  char *local_980;
  char *local_978;
  AssertHelper local_970;
  Message local_968;
  undefined4 local_95c;
  AssertionResult local_958;
  AssertHelper local_948;
  Message local_940;
  AssertionResult local_938;
  AssertHelper local_928;
  Message local_920;
  undefined4 local_914;
  AssertionResult local_910;
  char *local_900;
  AssertHelper local_8f8;
  Message local_8f0;
  undefined4 local_8e4;
  AssertionResult local_8e0;
  AssertHelper local_8d0;
  Message local_8c8;
  undefined4 local_8bc;
  AssertionResult local_8b8;
  AssertHelper local_8a8;
  Message local_8a0;
  undefined4 local_894;
  AssertionResult local_890;
  AssertHelper local_880;
  Message local_878;
  undefined4 local_86c;
  AssertionResult local_868;
  AssertHelper local_858;
  Message local_850;
  undefined4 local_844;
  AssertionResult local_840;
  AssertHelper local_830;
  Message local_828;
  AssertionResult local_820;
  AssertHelper local_810;
  Message local_808;
  AssertionResult local_800;
  AssertHelper local_7f0;
  Message local_7e8;
  AssertionResult local_7e0;
  AssertHelper local_7d0;
  Message local_7c8;
  AssertionResult local_7c0;
  AssertHelper local_7b0;
  Message local_7a8;
  AssertionResult local_7a0;
  AssertHelper local_790;
  Message local_788;
  AssertionResult local_780;
  AssertHelper local_770;
  Message local_768;
  undefined4 local_75c;
  AssertionResult local_758;
  AssertHelper local_748;
  Message local_740;
  undefined4 local_734;
  AssertionResult local_730;
  AssertHelper local_720;
  Message local_718;
  AssertionResult local_710;
  AssertHelper local_700;
  Message local_6f8;
  AssertionResult local_6f0;
  AssertHelper local_6e0;
  Message local_6d8;
  undefined4 local_6cc;
  AssertionResult local_6c8;
  uint local_6b4;
  char *local_6b0;
  AssertHelper local_6a8;
  Message local_6a0;
  undefined4 local_694;
  AssertionResult local_690;
  AssertHelper local_680;
  Message local_678;
  undefined4 local_66c;
  AssertionResult local_668;
  AssertHelper local_658;
  Message local_650;
  undefined4 local_644;
  AssertionResult local_640;
  AssertHelper local_630;
  Message local_628;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  uint32_t *in_stack_fffffffffffff9e8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9f0;
  uint32_t in_stack_fffffffffffff9fc;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa0c;
  AssertionResult local_5f0;
  AssertHelper in_stack_fffffffffffffa20;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  char **in_stack_fffffffffffffa38;
  AssertHelper local_5b8;
  Message local_5b0;
  undefined4 local_5a4;
  AssertionResult local_5a0;
  AssertHelper local_590;
  Message local_588;
  AssertionResult local_580;
  AssertHelper local_570;
  Message local_568;
  AssertionResult local_560;
  AssertHelper local_550;
  Message local_548;
  undefined4 local_53c;
  AssertionResult local_538;
  uint local_524;
  char *local_520;
  AssertHelper local_518;
  Message local_510;
  undefined4 local_504;
  AssertionResult local_500;
  uint local_4ec;
  undefined8 local_4e8;
  AssertHelper local_4e0;
  Message local_4d8;
  undefined4 local_4cc;
  AssertionResult local_4c8;
  AssertHelper local_4b8;
  Message local_4b0;
  undefined4 local_4a4;
  AssertionResult local_4a0;
  AssertHelper local_490;
  Message local_488;
  AssertionResult local_480;
  AssertHelper local_470;
  Message local_468;
  AssertionResult local_460;
  AssertHelper local_450;
  Message local_448;
  undefined4 local_43c;
  AssertionResult local_438;
  char *local_428;
  char *local_420;
  AssertHelper local_418;
  Message local_410;
  undefined4 local_404;
  AssertionResult local_400;
  AssertHelper local_3f0;
  Message local_3e8;
  AssertionResult local_3e0;
  AssertHelper local_3d0;
  Message local_3c8;
  undefined4 local_3bc;
  AssertionResult local_3b8;
  char *local_3a8;
  AssertHelper local_3a0;
  Message local_398;
  undefined4 local_38c;
  AssertionResult local_388;
  char *local_378;
  AssertHelper local_370;
  Message local_368;
  undefined4 local_35c;
  AssertionResult local_358;
  AssertHelper local_348;
  Message local_340;
  undefined4 local_334;
  AssertionResult local_330;
  AssertHelper local_320;
  Message local_318;
  undefined4 local_30c;
  AssertionResult local_308;
  AssertHelper local_2f8;
  Message local_2f0;
  undefined4 local_2e4;
  AssertionResult local_2e0;
  AssertHelper local_2d0;
  Message local_2c8;
  undefined4 local_2bc;
  AssertionResult local_2b8;
  AssertHelper local_2a8;
  Message local_2a0;
  AssertionResult local_298;
  AssertHelper local_288;
  Message local_280;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  AssertionResult local_258;
  AssertHelper local_248;
  Message local_240;
  undefined4 local_234;
  AssertionResult local_230;
  AssertHelper local_220;
  Message local_218;
  undefined4 local_20c;
  AssertionResult local_208;
  undefined8 local_1f8;
  char *local_1f0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  undefined8 local_1e0;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined4 local_1c4;
  AssertionResult local_1c0;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined4 local_19c;
  AssertionResult local_198;
  AssertHelper local_188;
  Message local_180;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_154;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  AssertionResult local_108;
  char *local_f8;
  undefined4 local_ec;
  char *local_e8;
  undefined4 local_dc;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  char *local_b0;
  undefined8 local_a8;
  undefined4 local_9c;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  vout_00 = (uint32_t)((ulong)in_stack_fffffffffffff0f0 >> 0x20);
  net_type_00 = (int)((ulong)in_stack_fffffffffffff400 >> 0x20);
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_ffffffffffffef18);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
             (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x39328a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x3d8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3932ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x393342);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,(type *)0x393376);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x3d9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x393472);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3934ed);
  local_9c = 1;
  local_a8 = 0;
  local_b0 = 
  "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQAiACA8rQYZ3mfmJHp2oQKBNjXAU0V8a6T95Kwf/YFI1w5LzAEBR1IhApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7IQJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQlKuIgICYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkIYnWtthiwAAIAAAACAAAAAgAAAAAAMAAAAIgICkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnsYKnBHYCwAAIAAAACAAAAAgAAAAAAMAAAAAA=="
  ;
  local_14 = CfdCreatePsbtHandle(in_stack_fffffffffffff408,net_type_00,
                                 (char *)CONCAT17(in_stack_fffffffffffff3ff,
                                                  in_stack_fffffffffffff3f8),
                                 in_stack_fffffffffffff3f0,
                                 (uint32_t)((ulong)in_stack_fffffffffffff3e8 >> 0x20),
                                 (uint32_t)in_stack_fffffffffffff3e8,in_stack_fffffffffffff420);
  local_c4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
             (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3935fe);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x3e0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x393661);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3936b9);
  if (local_14 == 0) {
    local_dc = 0;
    local_e8 = (char *)0x0;
    local_ec = 0;
    local_f8 = (char *)0x0;
    in_stack_ffffffffffffef00 = (AssertionResult *)&local_f8;
    in_stack_ffffffffffffef10 = (char *)0x0;
    in_stack_ffffffffffffef08 = (Secret *)0x0;
    ptVar6 = (type *)0x0;
    local_14 = CfdGetPsbtUtxoDataByIndex
                         ((void *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                          in_stack_fffffffffffffa00.ptr_,in_stack_fffffffffffff9fc,
                          (char **)in_stack_fffffffffffff9f0.ptr_,in_stack_fffffffffffff9e8,
                          (int64_t *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                          (char **)in_stack_fffffffffffffa20.data_,
                          (char **)in_stack_fffffffffffffa28.ptr_,
                          (char **)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                          in_stack_fffffffffffffa38);
    local_10c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
               (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
    if (!bVar1) {
      testing::Message::Message(&local_118);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3937f9);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,1000,pcVar5);
      testing::internal::AssertHelper::operator=(&local_120,&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      testing::Message::~Message((Message *)0x39385c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3938b1);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_130,
                 "\"544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69\"","txid",
                 "544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69",local_e8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
      if (!bVar1) {
        testing::Message::Message(&local_138);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x393960);
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3ea,pcVar5);
        testing::internal::AssertHelper::operator=(&local_140,&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        testing::Message::~Message((Message *)0x3939c3);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x393a18);
      local_154 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                 (int *)in_stack_ffffffffffffef08,(uint *)in_stack_ffffffffffffef00,ptVar6);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
      if (!bVar1) {
        testing::Message::Message(&local_160);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x393aca);
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3eb,pcVar5);
        testing::internal::AssertHelper::operator=(&local_168,&local_160);
        testing::internal::AssertHelper::~AssertHelper(&local_168);
        testing::Message::~Message((Message *)0x393b2d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x393b82);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_178,
                 "\"522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae\""
                 ,"script",
                 "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
                 ,local_f8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
      if (!bVar1) {
        testing::Message::Message(&local_180);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x393c23);
        testing::internal::AssertHelper::AssertHelper
                  (&local_188,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3ec,pcVar5);
        testing::internal::AssertHelper::operator=(&local_188,&local_180);
        testing::internal::AssertHelper::~AssertHelper(&local_188);
        testing::Message::~Message((Message *)0x393c86);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x393cde);
      local_14 = CfdGetPsbtTxInIndex(in_stack_fffffffffffff108,in_stack_fffffffffffff100,
                                     (char *)CONCAT17(in_stack_fffffffffffff0ff,
                                                      in_stack_fffffffffffff0f8),vout_00,
                                     in_stack_fffffffffffff0e8);
      local_19c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                 (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_198);
      if (!bVar1) {
        testing::Message::Message(&local_1a8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x393dbe);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3ef,pcVar5);
        testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
        testing::internal::AssertHelper::~AssertHelper(&local_1b0);
        testing::Message::~Message((Message *)0x393e21);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x393e76);
      local_1c4 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                 (int *)in_stack_ffffffffffffef08,(uint *)in_stack_ffffffffffffef00,ptVar6);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
      if (!bVar1) {
        testing::Message::Message(&local_1d0);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x393f28);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3f0,pcVar5);
        testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
        testing::internal::AssertHelper::~AssertHelper(&local_1d8);
        testing::Message::~Message((Message *)0x393f8b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x393fe3);
      local_1e0 = 0;
      local_1e8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1f0 = (char *)0x0;
      local_1f8 = 0;
      in_stack_ffffffffffffef08 = (Secret *)&local_1f8;
      in_stack_ffffffffffffef00 = (AssertionResult *)&local_1f0;
      local_14 = CfdGetPsbtUtxoData(in_stack_fffffffffffff0e8,
                                    (void *)CONCAT17(in_stack_fffffffffffff0e7,
                                                     in_stack_fffffffffffff0e0),
                                    &in_stack_fffffffffffff0d8->success_,
                                    (uint32_t)((ulong)in_stack_fffffffffffff0d0 >> 0x20),
                                    (int64_t *)
                                    CONCAT44(in_stack_fffffffffffff0cc,in_stack_fffffffffffff0c8),
                                    (char **)in_stack_fffffffffffff0c0,in_stack_fffffffffffff100,
                                    in_stack_fffffffffffff108,
                                    (char **)CONCAT17(in_stack_fffffffffffff117,
                                                      in_stack_fffffffffffff110));
      local_20c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                 (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
      if (!bVar1) {
        testing::Message::Message(&local_218);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x39411d);
        testing::internal::AssertHelper::AssertHelper
                  (&local_220,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3f7,pcVar5);
        testing::internal::AssertHelper::operator=(&local_220,&local_218);
        testing::internal::AssertHelper::~AssertHelper(&local_220);
        testing::Message::~Message((Message *)0x394180);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3941d8);
      if (local_14 == 0) {
        local_234 = 0x1dcd5808;
        testing::internal::EqHelper<false>::Compare<int,long>
                  ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                   (int *)in_stack_ffffffffffffef08,(long *)in_stack_ffffffffffffef00);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_230);
        if (!bVar1) {
          testing::Message::Message(&local_240);
          in_stack_fffffffffffff448 =
               testing::AssertionResult::failure_message((AssertionResult *)0x394293);
          testing::internal::AssertHelper::AssertHelper
                    (&local_248,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x3f9,in_stack_fffffffffffff448);
          testing::internal::AssertHelper::operator=(&local_248,&local_240);
          testing::internal::AssertHelper::~AssertHelper(&local_248);
          testing::Message::~Message((Message *)0x3942f6);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x39434b);
        in_stack_fffffffffffff438 = &local_258;
        testing::internal::CmpHelperSTREQ
                  ((internal *)in_stack_fffffffffffff438,
                   "\"a914945fb50391a70637c1ffc5ab7fb65308c2f2317587\"","locking_script",
                   "a914945fb50391a70637c1ffc5ab7fb65308c2f2317587",(char *)local_1e8.ptr_);
        in_stack_fffffffffffff447 =
             testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff438);
        if (!(bool)in_stack_fffffffffffff447) {
          testing::Message::Message(&local_260);
          in_stack_fffffffffffff430 =
               testing::AssertionResult::failure_message((AssertionResult *)0x3943ec);
          testing::internal::AssertHelper::AssertHelper
                    (&local_268,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x3fa,in_stack_fffffffffffff430);
          testing::internal::AssertHelper::operator=(&local_268,&local_260);
          testing::internal::AssertHelper::~AssertHelper(&local_268);
          testing::Message::~Message((Message *)0x39444f);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3944a4);
        pAVar7 = &local_278;
        testing::internal::CmpHelperSTREQ
                  ((internal *)pAVar7,
                   "\"sh(wsh(multi(2,[2a704760/44\'/0\'/0\'/0/11]03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3,[9d6b6d86/44\'/0\'/0\'/0/11]03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47)))\""
                   ,"descriptor",
                   "sh(wsh(multi(2,[2a704760/44\'/0\'/0\'/0/11]03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3,[9d6b6d86/44\'/0\'/0\'/0/11]03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47)))"
                   ,local_1f0);
        in_stack_fffffffffffff42f = testing::AssertionResult::operator_cast_to_bool(pAVar7);
        if (!(bool)in_stack_fffffffffffff42f) {
          testing::Message::Message(&local_280);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x394545);
          testing::internal::AssertHelper::AssertHelper
                    (&local_288,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x3fb,pcVar5);
          testing::internal::AssertHelper::operator=(&local_288,&local_280);
          testing::internal::AssertHelper::~AssertHelper(&local_288);
          testing::Message::~Message((Message *)0x3945a8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3945fd);
        pAVar7 = &local_298;
        testing::internal::EqHelper<true>::Compare<char>
                  ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                   in_stack_ffffffffffffef08,&in_stack_ffffffffffffef00->success_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
        if (!bVar1) {
          testing::Message::Message(&local_2a0);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x39469b);
          testing::internal::AssertHelper::AssertHelper
                    (&local_2a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x3fc,pcVar5);
          testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
          testing::internal::AssertHelper::~AssertHelper(&local_2a8);
          testing::Message::~Message((Message *)0x3946fe);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x394756);
        local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
        local_2bc = 0;
        pAVar7 = &local_2b8;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                   (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
        if (!bVar1) {
          testing::Message::Message(&local_2c8);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x394817);
          testing::internal::AssertHelper::AssertHelper
                    (&local_2d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x3fe,pcVar5);
          testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
          testing::internal::AssertHelper::~AssertHelper(&local_2d0);
          testing::Message::~Message((Message *)0x39487a);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3948d2);
        local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
        local_2e4 = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                   (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
        if (!bVar1) {
          testing::Message::Message(&local_2f0);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x394993);
          testing::internal::AssertHelper::AssertHelper
                    (&local_2f8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x400,pcVar5);
          testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
          testing::internal::AssertHelper::~AssertHelper(&local_2f8);
          testing::Message::~Message((Message *)0x3949f6);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x394a4e);
        local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
        local_30c = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                   (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
        if (!bVar1) {
          testing::Message::Message(&local_318);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x394b0f);
          testing::internal::AssertHelper::AssertHelper
                    (&local_320,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x402,pcVar5);
          testing::internal::AssertHelper::operator=(&local_320,&local_318);
          testing::internal::AssertHelper::~AssertHelper(&local_320);
          testing::Message::~Message((Message *)0x394b72);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x394bc7);
      }
      local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
      local_334 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                 (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_330);
      if (!bVar1) {
        testing::Message::Message(&local_340);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x394c8a);
        testing::internal::AssertHelper::AssertHelper
                  (&local_348,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x406,pcVar5);
        testing::internal::AssertHelper::operator=(&local_348,&local_340);
        testing::internal::AssertHelper::~AssertHelper(&local_348);
        testing::Message::~Message((Message *)0x394ced);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x394d45);
      local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
      local_35c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                 (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_358);
      if (!bVar1) {
        testing::Message::Message(&local_368);
        in_stack_fffffffffffff388 =
             testing::AssertionResult::failure_message((AssertionResult *)0x394e06);
        testing::internal::AssertHelper::AssertHelper
                  (&local_370,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x408,in_stack_fffffffffffff388);
        testing::internal::AssertHelper::operator=(&local_370,&local_368);
        testing::internal::AssertHelper::~AssertHelper(&local_370);
        testing::Message::~Message((Message *)0x394e69);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x394ebe);
    }
    local_378 = "03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3";
    local_14 = CfdIsFindPsbtPubkeyRecord
                         (in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                          in_stack_fffffffffffff36c,in_stack_fffffffffffff368,
                          in_stack_fffffffffffff360);
    local_38c = 0;
    pAVar7 = &local_388;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
               (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_398);
      in_stack_fffffffffffff370 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x394fac);
      testing::internal::AssertHelper::AssertHelper
                (&local_3a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x40d,(char *)in_stack_fffffffffffff370);
      testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
      testing::internal::AssertHelper::~AssertHelper(&local_3a0);
      testing::Message::~Message((Message *)0x39500f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x395067);
    local_3a8 = (char *)0x0;
    local_14 = CfdGetPsbtPubkeyRecord
                         (in_stack_fffffffffffff448,
                          (void *)CONCAT17(in_stack_fffffffffffff447,in_stack_fffffffffffff440),
                          (int)((ulong)in_stack_fffffffffffff438 >> 0x20),
                          (uint32_t)in_stack_fffffffffffff438,in_stack_fffffffffffff430,
                          (char **)CONCAT17(in_stack_fffffffffffff42f,in_stack_fffffffffffff428));
    local_3bc = 0;
    this_02 = &local_3b8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
               (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
    uVar9 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff36c);
    if (!bVar1) {
      testing::Message::Message(&local_3c8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x395158);
      testing::internal::AssertHelper::AssertHelper
                (&local_3d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x412,pcVar5);
      testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
      testing::internal::AssertHelper::~AssertHelper(&local_3d0);
      testing::Message::~Message((Message *)0x3951bb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x395210);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_3e0,
                 "\"3044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401\""
                 ,"signature",
                 "3044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401"
                 ,local_3a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e0);
      if (!bVar1) {
        testing::Message::Message(&local_3e8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3952bf);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x414,pcVar5);
        testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
        testing::internal::AssertHelper::~AssertHelper(&local_3f0);
        testing::Message::~Message((Message *)0x395322);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39537a);
      local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
      local_404 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                 (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_400);
      if (!bVar1) {
        testing::Message::Message(&local_410);
        in_stack_fffffffffffff328 =
             testing::AssertionResult::failure_message((AssertionResult *)0x39543b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_418,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x416,in_stack_fffffffffffff328);
        testing::internal::AssertHelper::operator=(&local_418,&local_410);
        testing::internal::AssertHelper::~AssertHelper(&local_418);
        testing::Message::~Message((Message *)0x39549e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3954f3);
    }
    local_420 = (char *)0x0;
    local_428 = (char *)0x0;
    local_14 = CfdGetPsbtBip32Data(in_stack_fffffffffffff5d8.ptr_,in_stack_fffffffffffff5d0,
                                   in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8,
                                   (char *)in_stack_fffffffffffff5c0.data_,
                                   (char **)in_stack_fffffffffffff5b8.ptr_,
                                   (char **)CONCAT44(in_stack_fffffffffffff5f4,
                                                     in_stack_fffffffffffff5f0));
    local_43c = 0;
    this_01 = &local_438;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
               (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
    uVar3 = testing::AssertionResult::operator_cast_to_bool(this_01);
    if (!(bool)uVar3) {
      testing::Message::Message(&local_448);
      in_stack_fffffffffffff310 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x395600);
      testing::internal::AssertHelper::AssertHelper
                (&local_450,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x41c,(char *)in_stack_fffffffffffff310);
      testing::internal::AssertHelper::operator=(&local_450,&local_448);
      testing::internal::AssertHelper::~AssertHelper(&local_450);
      testing::Message::~Message((Message *)0x395663);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3956b8);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_460,"\"2a704760\"","fingerprint","2a704760",local_420);
      in_stack_fffffffffffff30f = testing::AssertionResult::operator_cast_to_bool(&local_460);
      if (!(bool)in_stack_fffffffffffff30f) {
        testing::Message::Message(&local_468);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x395767);
        testing::internal::AssertHelper::AssertHelper
                  (&local_470,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x41e,pcVar5);
        testing::internal::AssertHelper::operator=(&local_470,&local_468);
        testing::internal::AssertHelper::~AssertHelper(&local_470);
        testing::Message::~Message((Message *)0x3957ca);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39581f);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_480,"\"44\'/0\'/0\'/0/11\"","path","44\'/0\'/0\'/0/11",local_428
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_480);
      if (!bVar1) {
        testing::Message::Message(&local_488);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3958c0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_490,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x41f,pcVar5);
        testing::internal::AssertHelper::operator=(&local_490,&local_488);
        testing::internal::AssertHelper::~AssertHelper(&local_490);
        testing::Message::~Message((Message *)0x395923);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39597b);
      local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
      local_4a4 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                 (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a0);
      if (!bVar1) {
        testing::Message::Message(&local_4b0);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x395a3c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x421,pcVar5);
        testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
        testing::internal::AssertHelper::~AssertHelper(&local_4b8);
        testing::Message::~Message((Message *)0x395a9f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x395af7);
      local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
      local_4cc = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                 (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c8);
      if (!bVar1) {
        testing::Message::Message(&local_4d8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x395bb8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x423,pcVar5);
        testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
        testing::internal::AssertHelper::~AssertHelper(&local_4e0);
        testing::Message::~Message((Message *)0x395c1b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x395c70);
    }
    local_4e8 = 0;
    local_4ec = 0;
    local_14 = CfdGetPsbtPubkeyList
                         (in_stack_fffffffffffff208,
                          (void *)CONCAT17(in_stack_fffffffffffff207,in_stack_fffffffffffff200),
                          (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20),
                          (uint32_t)in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0,
                          (void **)CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8));
    local_504 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
               (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_500);
    if (!bVar1) {
      testing::Message::Message(&local_510);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x395d6e);
      testing::internal::AssertHelper::AssertHelper
                (&local_518,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x429,pcVar5);
      testing::internal::AssertHelper::operator=(&local_518,&local_510);
      testing::internal::AssertHelper::~AssertHelper(&local_518);
      testing::Message::~Message((Message *)0x395dd1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x395e29);
    if (local_14 == 0) {
      local_520 = (char *)0x0;
      local_420 = (char *)0x0;
      local_428 = (char *)0x0;
      for (local_524 = 0; local_524 < local_4ec; local_524 = local_524 + 1) {
        local_14 = CfdGetPsbtPubkeyListData
                             (in_stack_fffffffffffff328,
                              (void *)CONCAT17(uVar3,in_stack_fffffffffffff320),
                              (uint32_t)((ulong)this_01 >> 0x20),in_stack_fffffffffffff310,
                              (char **)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308)
                             );
        local_53c = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                   (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_538);
        if (!bVar1) {
          testing::Message::Message(&local_548);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x395f57);
          testing::internal::AssertHelper::AssertHelper
                    (&local_550,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x430,pcVar5);
          testing::internal::AssertHelper::operator=(&local_550,&local_548);
          testing::internal::AssertHelper::~AssertHelper(&local_550);
          testing::Message::~Message((Message *)0x395fba);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x396012);
        if (local_14 == 0) {
          if (local_524 == 0) {
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_560,
                       "\"03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3\"","pk"
                       ,"03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3",
                       local_520);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_560);
            if (!bVar1) {
              testing::Message::Message(&local_568);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3960cf);
              testing::internal::AssertHelper::AssertHelper
                        (&local_570,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x433,pcVar5);
              testing::internal::AssertHelper::operator=(&local_570,&local_568);
              testing::internal::AssertHelper::~AssertHelper(&local_570);
              testing::Message::~Message((Message *)0x396132);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x396187);
          }
          else if (local_524 == 1) {
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_580,
                       "\"03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47\"","pk"
                       ,"03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47",
                       local_520);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_580);
            if (!bVar1) {
              testing::Message::Message(&local_588);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x39623b);
              testing::internal::AssertHelper::AssertHelper
                        (&local_590,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x435,pcVar5);
              testing::internal::AssertHelper::operator=(&local_590,&local_588);
              testing::internal::AssertHelper::~AssertHelper(&local_590);
              testing::Message::~Message((Message *)0x39629e);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x3962f3);
          }
          local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
          local_5a4 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                     (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5a0);
          if (!bVar1) {
            testing::Message::Message(&local_5b0);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3963b8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_5b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x438,pcVar5);
            testing::internal::AssertHelper::operator=(&local_5b8,&local_5b0);
            testing::internal::AssertHelper::~AssertHelper(&local_5b8);
            testing::Message::~Message((Message *)0x39641b);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x396470);
          local_520 = (char *)0x0;
        }
        local_14 = CfdGetPsbtPubkeyListBip32Data
                             (in_stack_fffffffffffff388,
                              (void *)CONCAT17(uVar2,in_stack_fffffffffffff380),
                              (uint32_t)((ulong)pAVar7 >> 0x20),in_stack_fffffffffffff370,
                              (char **)CONCAT44(uVar9,in_stack_fffffffffffff368),(char **)this_02);
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                   (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xfffffffffffffa38);
        if (!bVar1) {
          testing::Message::Message((Message *)&stack0xfffffffffffffa28);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x396566);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffa20,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x43c,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffa20,(Message *)&stack0xfffffffffffffa28);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffa20);
          testing::Message::~Message((Message *)0x3965c9);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x396621);
        if (local_14 == 0) {
          local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                     (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5f0);
          if (!bVar1) {
            testing::Message::Message((Message *)&stack0xfffffffffffffa00);
            in_stack_fffffffffffff208 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x3966f0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffff9f8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x43f,in_stack_fffffffffffff208);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffff9f8,(Message *)&stack0xfffffffffffffa00)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff9f8)
            ;
            testing::Message::~Message((Message *)0x396753);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3967ab);
          local_520 = (char *)0x0;
          local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
          in_stack_fffffffffffff1f8 = (AssertionResult *)&stack0xfffffffffffff9e8;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                     (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
          in_stack_fffffffffffff207 =
               testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff1f8);
          if (!(bool)in_stack_fffffffffffff207) {
            testing::Message::Message(&local_628);
            in_stack_fffffffffffff1f0 =
                 (uint32_t *)testing::AssertionResult::failure_message((AssertionResult *)0x396878);
            testing::internal::AssertHelper::AssertHelper
                      (&local_630,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x442,(char *)in_stack_fffffffffffff1f0);
            testing::internal::AssertHelper::operator=(&local_630,&local_628);
            testing::internal::AssertHelper::~AssertHelper(&local_630);
            testing::Message::~Message((Message *)0x3968db);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x396933);
          local_420 = (char *)0x0;
          local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
          local_644 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                     (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
          in_stack_fffffffffffff1ef = testing::AssertionResult::operator_cast_to_bool(&local_640);
          if (!(bool)in_stack_fffffffffffff1ef) {
            testing::Message::Message(&local_650);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x396a00);
            testing::internal::AssertHelper::AssertHelper
                      (&local_658,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x445,pcVar5);
            testing::internal::AssertHelper::operator=(&local_658,&local_650);
            testing::internal::AssertHelper::~AssertHelper(&local_658);
            testing::Message::~Message((Message *)0x396a63);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x396ab8);
          local_428 = (char *)0x0;
        }
      }
      local_14 = CfdFreePsbtPubkeyList(in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0);
      local_66c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                 (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_668);
      if (!bVar1) {
        testing::Message::Message(&local_678);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x396ba7);
        testing::internal::AssertHelper::AssertHelper
                  (&local_680,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x44a,pcVar5);
        testing::internal::AssertHelper::operator=(&local_680,&local_678);
        testing::internal::AssertHelper::~AssertHelper(&local_680);
        testing::Message::~Message((Message *)0x396c0a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x396c5f);
    }
    local_4e8 = 0;
    local_4ec = 0;
    local_14 = CfdGetPsbtPubkeyList
                         (in_stack_fffffffffffff208,
                          (void *)CONCAT17(in_stack_fffffffffffff207,in_stack_fffffffffffff200),
                          (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20),
                          (uint32_t)in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0,
                          (void **)CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8));
    local_694 = 0;
    this_00 = &local_690;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
               (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
    uVar4 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!(bool)uVar4) {
      testing::Message::Message(&local_6a0);
      in_stack_fffffffffffff1a8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x396d5d);
      testing::internal::AssertHelper::AssertHelper
                (&local_6a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x451,in_stack_fffffffffffff1a8);
      testing::internal::AssertHelper::operator=(&local_6a8,&local_6a0);
      testing::internal::AssertHelper::~AssertHelper(&local_6a8);
      testing::Message::~Message((Message *)0x396dc0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x396e18);
    if (local_14 == 0) {
      local_6b0 = (char *)0x0;
      local_420 = (char *)0x0;
      local_428 = (char *)0x0;
      for (local_6b4 = 0; local_6b4 < local_4ec; local_6b4 = local_6b4 + 1) {
        local_14 = CfdGetPsbtPubkeyListData
                             (in_stack_fffffffffffff328,
                              (void *)CONCAT17(uVar3,in_stack_fffffffffffff320),
                              (uint32_t)((ulong)this_01 >> 0x20),in_stack_fffffffffffff310,
                              (char **)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308)
                             );
        local_6cc = 0;
        in_stack_fffffffffffff198 = &local_6c8;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                   (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
        in_stack_fffffffffffff1a7 =
             testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff198);
        if (!(bool)in_stack_fffffffffffff1a7) {
          testing::Message::Message(&local_6d8);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x396f46);
          testing::internal::AssertHelper::AssertHelper
                    (&local_6e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x458,pcVar5);
          testing::internal::AssertHelper::operator=(&local_6e0,&local_6d8);
          testing::internal::AssertHelper::~AssertHelper(&local_6e0);
          testing::Message::~Message((Message *)0x396fa9);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x397001);
        if (local_14 == 0) {
          if (local_6b4 == 0) {
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_6f0,
                       "\"03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3\"","pk"
                       ,"03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3",
                       local_6b0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6f0);
            if (!bVar1) {
              testing::Message::Message(&local_6f8);
              in_stack_fffffffffffff178 =
                   testing::AssertionResult::failure_message((AssertionResult *)0x3970be);
              testing::internal::AssertHelper::AssertHelper
                        (&local_700,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x45b,in_stack_fffffffffffff178);
              testing::internal::AssertHelper::operator=(&local_700,&local_6f8);
              testing::internal::AssertHelper::~AssertHelper(&local_700);
              testing::Message::~Message((Message *)0x397121);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x397176);
          }
          else if (local_6b4 == 1) {
            in_stack_fffffffffffff168 = &local_710;
            testing::internal::CmpHelperSTREQ
                      ((internal *)in_stack_fffffffffffff168,
                       "\"03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47\"","pk"
                       ,"03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47",
                       local_6b0);
            in_stack_fffffffffffff177 =
                 testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff168);
            if (!(bool)in_stack_fffffffffffff177) {
              testing::Message::Message(&local_718);
              in_stack_fffffffffffff160 =
                   testing::AssertionResult::failure_message((AssertionResult *)0x39722a);
              testing::internal::AssertHelper::AssertHelper
                        (&local_720,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x45d,in_stack_fffffffffffff160);
              testing::internal::AssertHelper::operator=(&local_720,&local_718);
              testing::internal::AssertHelper::~AssertHelper(&local_720);
              testing::Message::~Message((Message *)0x39728d);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x3972e2);
          }
          local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
          local_734 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                     (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
          in_stack_fffffffffffff15f = testing::AssertionResult::operator_cast_to_bool(&local_730);
          if (!(bool)in_stack_fffffffffffff15f) {
            testing::Message::Message(&local_740);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3973a7);
            testing::internal::AssertHelper::AssertHelper
                      (&local_748,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x460,pcVar5);
            testing::internal::AssertHelper::operator=(&local_748,&local_740);
            testing::internal::AssertHelper::~AssertHelper(&local_748);
            testing::Message::~Message((Message *)0x39740a);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x39745f);
          local_6b0 = (char *)0x0;
        }
        local_14 = CfdGetPsbtPubkeyListBip32Data
                             (in_stack_fffffffffffff388,
                              (void *)CONCAT17(uVar2,in_stack_fffffffffffff380),
                              (uint32_t)((ulong)pAVar7 >> 0x20),in_stack_fffffffffffff370,
                              (char **)CONCAT44(uVar9,in_stack_fffffffffffff368),(char **)this_02);
        local_75c = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                   (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_758);
        if (!bVar1) {
          testing::Message::Message(&local_768);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x397555);
          testing::internal::AssertHelper::AssertHelper
                    (&local_770,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x464,pcVar5);
          testing::internal::AssertHelper::operator=(&local_770,&local_768);
          testing::internal::AssertHelper::~AssertHelper(&local_770);
          testing::Message::~Message((Message *)0x3975b8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x397610);
        CfdcapiPsbtDumpLog((int)((ulong)in_stack_ffffffffffffef40 >> 0x20),in_stack_ffffffffffffef38
                          );
        if (local_14 == 0) {
          if (local_6b4 == 0) {
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_780,
                       "\"03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3\"","pk"
                       ,"03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3",
                       local_6b0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_780);
            if (!bVar1) {
              testing::Message::Message(&local_788);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3976e1);
              testing::internal::AssertHelper::AssertHelper
                        (&local_790,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x468,pcVar5);
              testing::internal::AssertHelper::operator=(&local_790,&local_788);
              testing::internal::AssertHelper::~AssertHelper(&local_790);
              testing::Message::~Message((Message *)0x397744);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x397799);
            pAVar8 = &local_7a0;
            testing::internal::CmpHelperSTREQ
                      ((internal *)pAVar8,"\"2a704760\"","fingerprint","2a704760",local_420);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
            if (!bVar1) {
              testing::Message::Message(&local_7a8);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x39783a);
              testing::internal::AssertHelper::AssertHelper
                        (&local_7b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x469,pcVar5);
              testing::internal::AssertHelper::operator=(&local_7b0,&local_7a8);
              testing::internal::AssertHelper::~AssertHelper(&local_7b0);
              testing::Message::~Message((Message *)0x39789d);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x3978f2);
            pAVar8 = &local_7c0;
            testing::internal::CmpHelperSTREQ
                      ((internal *)pAVar8,"\"44\'/0\'/0\'/0/11\"","path","44\'/0\'/0\'/0/11",
                       local_428);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
            if (!bVar1) {
              testing::Message::Message(&local_7c8);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x397993);
              testing::internal::AssertHelper::AssertHelper
                        (&local_7d0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x46a,pcVar5);
              testing::internal::AssertHelper::operator=(&local_7d0,&local_7c8);
              testing::internal::AssertHelper::~AssertHelper(&local_7d0);
              testing::Message::~Message((Message *)0x3979f6);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x397a4b);
          }
          else if (local_6b4 == 1) {
            in_stack_fffffffffffff0d8 = &local_7e0;
            testing::internal::CmpHelperSTREQ
                      ((internal *)in_stack_fffffffffffff0d8,
                       "\"03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47\"","pk"
                       ,"03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47",
                       local_6b0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff0d8);
            if (!bVar1) {
              testing::Message::Message(&local_7e8);
              in_stack_fffffffffffff0d0 =
                   testing::AssertionResult::failure_message((AssertionResult *)0x397aff);
              testing::internal::AssertHelper::AssertHelper
                        (&local_7f0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x46c,in_stack_fffffffffffff0d0);
              testing::internal::AssertHelper::operator=(&local_7f0,&local_7e8);
              testing::internal::AssertHelper::~AssertHelper(&local_7f0);
              testing::Message::~Message((Message *)0x397b62);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x397bb7);
            in_stack_fffffffffffff0c0 = &local_800;
            testing::internal::CmpHelperSTREQ
                      ((internal *)in_stack_fffffffffffff0c0,"\"9d6b6d86\"","fingerprint","9d6b6d86"
                       ,local_420);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff0c0);
            in_stack_fffffffffffff0cc = CONCAT13(bVar1,(int3)in_stack_fffffffffffff0cc);
            if (!bVar1) {
              testing::Message::Message(&local_808);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x397c58);
              testing::internal::AssertHelper::AssertHelper
                        (&local_810,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x46d,pcVar5);
              testing::internal::AssertHelper::operator=(&local_810,&local_808);
              testing::internal::AssertHelper::~AssertHelper(&local_810);
              testing::Message::~Message((Message *)0x397cbb);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x397d10);
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_820,"\"44\'/0\'/0\'/0/11\"","path","44\'/0\'/0\'/0/11",
                       local_428);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_820);
            if (!bVar1) {
              testing::Message::Message(&local_828);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x397db1);
              testing::internal::AssertHelper::AssertHelper
                        (&local_830,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x46e,pcVar5);
              testing::internal::AssertHelper::operator=(&local_830,&local_828);
              testing::internal::AssertHelper::~AssertHelper(&local_830);
              testing::Message::~Message((Message *)0x397e14);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x397e69);
          }
          local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
          local_844 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                     (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_840);
          if (!bVar1) {
            testing::Message::Message(&local_850);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x397f2e);
            testing::internal::AssertHelper::AssertHelper
                      (&local_858,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x471,pcVar5);
            testing::internal::AssertHelper::operator=(&local_858,&local_850);
            testing::internal::AssertHelper::~AssertHelper(&local_858);
            testing::Message::~Message((Message *)0x397f91);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x397fe9);
          local_6b0 = (char *)0x0;
          local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
          local_86c = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                     (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_868);
          if (!bVar1) {
            testing::Message::Message(&local_878);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3980b6);
            testing::internal::AssertHelper::AssertHelper
                      (&local_880,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x474,pcVar5);
            testing::internal::AssertHelper::operator=(&local_880,&local_878);
            testing::internal::AssertHelper::~AssertHelper(&local_880);
            testing::Message::~Message((Message *)0x398119);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x398171);
          local_420 = (char *)0x0;
          local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
          local_894 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                     (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_890);
          if (!bVar1) {
            testing::Message::Message(&local_8a0);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x39823e);
            testing::internal::AssertHelper::AssertHelper
                      (&local_8a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x477,pcVar5);
            testing::internal::AssertHelper::operator=(&local_8a8,&local_8a0);
            testing::internal::AssertHelper::~AssertHelper(&local_8a8);
            testing::Message::~Message((Message *)0x3982a1);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3982f6);
          local_428 = (char *)0x0;
        }
      }
      local_14 = CfdFreePsbtPubkeyList(in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0);
      local_8bc = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                 (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8b8);
      if (!bVar1) {
        testing::Message::Message(&local_8c8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3983e5);
        testing::internal::AssertHelper::AssertHelper
                  (&local_8d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x47c,pcVar5);
        testing::internal::AssertHelper::operator=(&local_8d0,&local_8c8);
        testing::internal::AssertHelper::~AssertHelper(&local_8d0);
        testing::Message::~Message((Message *)0x398448);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39849d);
    }
    local_14 = CfdIsFindPsbtRecord(in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0,
                                   in_stack_fffffffffffff0cc,in_stack_fffffffffffff0c8,
                                   &in_stack_fffffffffffff0c0->success_);
    local_8e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
               (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8e0);
    if (!bVar1) {
      testing::Message::Message(&local_8f0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x398576);
      testing::internal::AssertHelper::AssertHelper
                (&local_8f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x480,pcVar5);
      testing::internal::AssertHelper::operator=(&local_8f8,&local_8f0);
      testing::internal::AssertHelper::~AssertHelper(&local_8f8);
      testing::Message::~Message((Message *)0x3985d9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x398631);
    local_900 = (char *)0x0;
    local_14 = CfdGetPsbtRecord((void *)CONCAT17(uVar4,in_stack_fffffffffffff1b8),this_00,
                                (int)((ulong)in_stack_fffffffffffff1a8 >> 0x20),
                                (uint32_t)in_stack_fffffffffffff1a8,
                                (char *)CONCAT17(in_stack_fffffffffffff1a7,in_stack_fffffffffffff1a0
                                                ),(char **)in_stack_fffffffffffff198);
    local_914 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
               (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_910);
    if (!bVar1) {
      testing::Message::Message(&local_920);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x39871c);
      testing::internal::AssertHelper::AssertHelper
                (&local_928,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x484,pcVar5);
      testing::internal::AssertHelper::operator=(&local_928,&local_920);
      testing::internal::AssertHelper::~AssertHelper(&local_928);
      testing::Message::~Message((Message *)0x39877f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3987d4);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_938,
                 "\"0858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587\"","value",
                 "0858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587",local_900);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_938);
      if (!bVar1) {
        testing::Message::Message(&local_940);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x398883);
        testing::internal::AssertHelper::AssertHelper
                  (&local_948,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x486,pcVar5);
        testing::internal::AssertHelper::operator=(&local_948,&local_940);
        testing::internal::AssertHelper::~AssertHelper(&local_948);
        testing::Message::~Message((Message *)0x3988e6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39893e);
      local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
      local_95c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                 (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_958);
      if (!bVar1) {
        testing::Message::Message(&local_968);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3989ff);
        testing::internal::AssertHelper::AssertHelper
                  (&local_970,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x489,pcVar5);
        testing::internal::AssertHelper::operator=(&local_970,&local_968);
        testing::internal::AssertHelper::~AssertHelper(&local_970);
        testing::Message::~Message((Message *)0x398a62);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x398ab7);
      local_900 = (char *)0x0;
    }
    local_978 = "99";
    local_980 = "0011223344";
    local_14 = CfdIsFindPsbtRecord(in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0,
                                   in_stack_fffffffffffff0cc,in_stack_fffffffffffff0c8,
                                   &in_stack_fffffffffffff0c0->success_);
    local_994 = 8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
               (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_990);
    if (!bVar1) {
      testing::Message::Message(&local_9a0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x398bbb);
      testing::internal::AssertHelper::AssertHelper
                (&local_9a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x490,pcVar5);
      testing::internal::AssertHelper::operator=(&local_9a8,&local_9a0);
      testing::internal::AssertHelper::~AssertHelper(&local_9a8);
      testing::Message::~Message((Message *)0x398c1e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x398c76);
    local_14 = CfdAddPsbtRecord(in_stack_fffffffffffff178,
                                (void *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170
                                                ),(int)((ulong)in_stack_fffffffffffff168 >> 0x20),
                                (uint32_t)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                                (char *)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158
                                                ));
    local_9bc = 0;
    pAVar7 = &local_9b8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
               (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
    if (!bVar1) {
      testing::Message::Message(&local_9c8);
      in_stack_ffffffffffffefb0 =
           testing::AssertionResult::failure_message((AssertionResult *)0x398d56);
      testing::internal::AssertHelper::AssertHelper
                (&local_9d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x493,in_stack_ffffffffffffefb0);
      testing::internal::AssertHelper::operator=(&local_9d0,&local_9c8);
      testing::internal::AssertHelper::~AssertHelper(&local_9d0);
      testing::Message::~Message((Message *)0x398db9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x398e11);
    local_14 = CfdIsFindPsbtRecord(in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0,
                                   in_stack_fffffffffffff0cc,in_stack_fffffffffffff0c8,
                                   &in_stack_fffffffffffff0c0->success_);
    local_9e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
               (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9e0);
    if (!bVar1) {
      testing::Message::Message(&local_9f0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x398ee9);
      testing::internal::AssertHelper::AssertHelper
                (&local_9f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x496,pcVar5);
      testing::internal::AssertHelper::operator=(&local_9f8,&local_9f0);
      testing::internal::AssertHelper::~AssertHelper(&local_9f8);
      testing::Message::~Message((Message *)0x398f4c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x398fa4);
    local_900 = (char *)0x0;
    local_14 = CfdGetPsbtRecord((void *)CONCAT17(uVar4,in_stack_fffffffffffff1b8),this_00,
                                (int)((ulong)in_stack_fffffffffffff1a8 >> 0x20),
                                (uint32_t)in_stack_fffffffffffff1a8,
                                (char *)CONCAT17(in_stack_fffffffffffff1a7,in_stack_fffffffffffff1a0
                                                ),(char **)in_stack_fffffffffffff198);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
               (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a08);
    if (!bVar1) {
      testing::Message::Message(&local_a18);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x399090);
      testing::internal::AssertHelper::AssertHelper
                (&local_a20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x49a,pcVar5);
      testing::internal::AssertHelper::operator=(&local_a20,&local_a18);
      testing::internal::AssertHelper::~AssertHelper(&local_a20);
      testing::Message::~Message((Message *)0x3990f3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x399148);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffff5d0,"exp_unknown_value","value",local_980,
                 local_900);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffff5d0);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffff5c8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3991f2);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffff5c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x49c,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffff5c0,(Message *)&stack0xfffffffffffff5c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff5c0);
        testing::Message::~Message((Message *)0x39924f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3992a4);
      local_14 = CfdFreeStringBuffer((char *)in_stack_ffffffffffffef08);
      local_a54 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                 (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffff5b0);
      if (!bVar1) {
        testing::Message::Message(&local_a60);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x399359);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x49f,pcVar5);
        testing::internal::AssertHelper::operator=(&local_a68,&local_a60);
        testing::internal::AssertHelper::~AssertHelper(&local_a68);
        testing::Message::~Message((Message *)0x3993b6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39940b);
      local_900 = (char *)0x0;
    }
    local_14 = CfdFreePsbtHandle(pAVar7,in_stack_ffffffffffffefb0);
    local_a7c = 0;
    pAVar7 = &local_a78;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
               (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
    if (!bVar1) {
      testing::Message::Message(&local_a88);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3994d6);
      testing::internal::AssertHelper::AssertHelper
                (&local_a90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x4a4,pcVar5);
      testing::internal::AssertHelper::operator=(&local_a90,&local_a88);
      testing::internal::AssertHelper::~AssertHelper(&local_a90);
      testing::Message::~Message((Message *)0x399533);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x399588);
  }
  local_14 = CfdFreeHandle(in_stack_ffffffffffffef08);
  local_aa4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
             (CfdErrorCode *)in_stack_ffffffffffffef08,(int *)in_stack_ffffffffffffef00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_aa0);
  if (!bVar1) {
    testing::Message::Message(&local_ab0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x39963f);
    testing::internal::AssertHelper::AssertHelper
              (&local_ab8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x4a8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_ab8,&local_ab0);
    testing::internal::AssertHelper::~AssertHelper(&local_ab8);
    testing::Message::~Message((Message *)0x39969c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3996f1);
  return;
}

Assistant:

TEST(cfdcapi_psbt, GetPsbtInput) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* psbt_base64 = "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQAiACA8rQYZ3mfmJHp2oQKBNjXAU0V8a6T95Kwf/YFI1w5LzAEBR1IhApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7IQJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQlKuIgICYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkIYnWtthiwAAIAAAACAAAAAgAAAAAAMAAAAIgICkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnsYKnBHYCwAAIAAAACAAAAAgAAAAAAMAAAAAA==";
  ret = CfdCreatePsbtHandle(
    handle, net_type, psbt_base64, "", 0, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    uint32_t txin_index = 0;

    char* txid = nullptr;
    uint32_t vout = 0;
    char* script = nullptr;
    ret = CfdGetPsbtUtxoDataByIndex(handle, psbt_handle, 0, &txid, &vout, nullptr, nullptr, &script, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69", txid);
      EXPECT_EQ(0, vout);
      EXPECT_STREQ("522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae", script);

      ret = CfdGetPsbtTxInIndex(handle, psbt_handle, txid, vout, &txin_index);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(0, txin_index);

      int64_t amount = 0;
      char* locking_script = nullptr;
      char* descriptor = nullptr;
      char* tx = nullptr;
      ret = CfdGetPsbtUtxoData(handle, psbt_handle, txid, vout, &amount, &locking_script, nullptr, &descriptor, &tx);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_EQ(499996680, amount);
        EXPECT_STREQ("a914945fb50391a70637c1ffc5ab7fb65308c2f2317587", locking_script);
        EXPECT_STREQ("sh(wsh(multi(2,[2a704760/44'/0'/0'/0/11]03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3,[9d6b6d86/44'/0'/0'/0/11]03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47)))", descriptor);
        EXPECT_EQ(nullptr, tx);
        ret = CfdFreeStringBuffer(locking_script);
        EXPECT_EQ(kCfdSuccess, ret);
        ret = CfdFreeStringBuffer(descriptor);
        EXPECT_EQ(kCfdSuccess, ret);
        ret = CfdFreeStringBuffer(tx);
        EXPECT_EQ(kCfdSuccess, ret);
      }

      ret = CfdFreeStringBuffer(txid);
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdFreeStringBuffer(script);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    const char* pubkey = "03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3";
    ret = CfdIsFindPsbtPubkeyRecord(handle, psbt_handle, kCfdPsbtRecordInputSignature, txin_index, pubkey);
    EXPECT_EQ(kCfdSuccess, ret);

    char* signature = nullptr;
    ret = CfdGetPsbtPubkeyRecord(handle, psbt_handle,
        kCfdPsbtRecordInputSignature, txin_index, pubkey, &signature);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("3044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401", signature);
      ret = CfdFreeStringBuffer(signature);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    char* fingerprint = nullptr;
    char* path = nullptr;
    ret = CfdGetPsbtBip32Data(handle, psbt_handle, kCfdPsbtRecordInputBip32, txin_index, pubkey, &fingerprint, &path);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("2a704760", fingerprint);
      EXPECT_STREQ("44'/0'/0'/0/11", path);
      ret = CfdFreeStringBuffer(fingerprint);
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdFreeStringBuffer(path);
      EXPECT_EQ(kCfdSuccess, ret);
    }
    void* pubkey_list_handle = nullptr;
    uint32_t list_num = 0;
    ret = CfdGetPsbtPubkeyList(handle, psbt_handle, kCfdPsbtRecordInputSignature,
        txin_index, &list_num, &pubkey_list_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      char* pk = nullptr;
      fingerprint = nullptr;
      path = nullptr;
      for (uint32_t index=0; index<list_num; ++index) {
        ret = CfdGetPsbtPubkeyListData(handle, pubkey_list_handle, index, &pk, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret == kCfdSuccess) {
          if (index == 0) {
            EXPECT_STREQ("03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3", pk);
          } else if (index == 1) {
            EXPECT_STREQ("03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47", pk);
          }
          ret = CfdFreeStringBuffer(pk);
          EXPECT_EQ(kCfdSuccess, ret);
          pk = nullptr;
        }
        ret = CfdGetPsbtPubkeyListBip32Data(handle, pubkey_list_handle, index, &pk, &fingerprint, &path);
        EXPECT_EQ(kCfdIllegalArgumentError, ret);
        if (ret == kCfdSuccess) {
          ret = CfdFreeStringBuffer(pk);
          EXPECT_EQ(kCfdSuccess, ret);
          pk = nullptr;
          ret = CfdFreeStringBuffer(fingerprint);
          EXPECT_EQ(kCfdSuccess, ret);
          fingerprint = nullptr;
          ret = CfdFreeStringBuffer(path);
          EXPECT_EQ(kCfdSuccess, ret);
          path = nullptr;
        }
      }
      ret = CfdFreePsbtPubkeyList(handle, pubkey_list_handle);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    pubkey_list_handle = nullptr;
    list_num = 0;
    ret = CfdGetPsbtPubkeyList(handle, psbt_handle, kCfdPsbtRecordInputBip32,
        txin_index, &list_num, &pubkey_list_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      char* pk = nullptr;
      fingerprint = nullptr;
      path = nullptr;
      for (uint32_t index=0; index<list_num; ++index) {
        ret = CfdGetPsbtPubkeyListData(handle, pubkey_list_handle, index, &pk, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret == kCfdSuccess) {
          if (index == 0) {
            EXPECT_STREQ("03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3", pk);
          } else if (index == 1) {
            EXPECT_STREQ("03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47", pk);
          }
          ret = CfdFreeStringBuffer(pk);
          EXPECT_EQ(kCfdSuccess, ret);
          pk = nullptr;
        }
        ret = CfdGetPsbtPubkeyListBip32Data(handle, pubkey_list_handle, index, &pk, &fingerprint, &path);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdcapiPsbtDumpLog(ret, handle);
        if (ret == kCfdSuccess) {
          if (index == 0) {
            EXPECT_STREQ("03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3", pk);
            EXPECT_STREQ("2a704760", fingerprint);
            EXPECT_STREQ("44'/0'/0'/0/11", path);
          } else if (index == 1) {
            EXPECT_STREQ("03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47", pk);
            EXPECT_STREQ("9d6b6d86", fingerprint);
            EXPECT_STREQ("44'/0'/0'/0/11", path);
          }
          ret = CfdFreeStringBuffer(pk);
          EXPECT_EQ(kCfdSuccess, ret);
          pk = nullptr;
          ret = CfdFreeStringBuffer(fingerprint);
          EXPECT_EQ(kCfdSuccess, ret);
          fingerprint = nullptr;
          ret = CfdFreeStringBuffer(path);
          EXPECT_EQ(kCfdSuccess, ret);
          path = nullptr;
        }
      }
      ret = CfdFreePsbtPubkeyList(handle, pubkey_list_handle);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    ret = CfdIsFindPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeInput, 0, "01");
    EXPECT_EQ(kCfdSuccess, ret);

    char* value = nullptr;
    ret = CfdGetPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeInput, 0, "01", &value);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587", value);

      ret = CfdFreeStringBuffer(value);
      EXPECT_EQ(kCfdSuccess, ret);
      value = nullptr;
    }

    const char* unknown_key = "99";
    const char* exp_unknown_value = "0011223344";
    ret = CfdIsFindPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeInput, 0, unknown_key);
    EXPECT_EQ(kCfdNotFoundError, ret);

    ret = CfdAddPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeInput, 0, unknown_key, exp_unknown_value);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdIsFindPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeInput, 0, unknown_key);
    EXPECT_EQ(kCfdSuccess, ret);

    value = nullptr;
    ret = CfdGetPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeInput, 0, unknown_key, &value);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_unknown_value, value);

      ret = CfdFreeStringBuffer(value);
      EXPECT_EQ(kCfdSuccess, ret);
      value = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}